

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  bool bVar1;
  reference ppcVar2;
  ulong uVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_00;
  undefined1 local_388 [16];
  string local_378;
  undefined1 local_358 [8];
  ostringstream w;
  string local_1d8 [8];
  string text;
  cmOrderDirectoriesConstraint *entry;
  iterator __end1;
  iterator __begin1;
  vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_> *__range1;
  ostringstream conflicts;
  cmOrderDirectories *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1 = std::
           vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>::
           begin(&this->ImplicitDirEntries);
  entry = (cmOrderDirectoriesConstraint *)
          std::
          vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>::
          end(&this->ImplicitDirEntries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmOrderDirectoriesConstraint_**,_std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>_>
                                     *)&entry), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmOrderDirectoriesConstraint_**,_std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>_>
              ::operator*(&__end1);
    cmOrderDirectoriesConstraint::FindImplicitConflicts(*ppcVar2,(ostringstream *)&__range1);
    __gnu_cxx::
    __normal_iterator<cmOrderDirectoriesConstraint_**,_std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
    poVar4 = std::operator<<((ostream *)local_358,"Cannot generate a safe ");
    poVar4 = std::operator<<(poVar4,(string *)&this->Purpose);
    poVar4 = std::operator<<(poVar4," for target ");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," because files in some directories may conflict with ");
    poVar4 = std::operator<<(poVar4," libraries in implicit directories:\n");
    poVar4 = std::operator<<(poVar4,local_1d8);
    std::operator<<(poVar4,"Some of these libraries may not be found correctly.");
    this_00 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_388);
    cmake::IssueMessage(this_00,WARNING,(string *)(local_388 + 0x10),
                        (cmListFileBacktrace *)local_388);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_388);
    std::__cxx11::string::~string((string *)(local_388 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
  }
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (cmOrderDirectoriesConstraint* entry : this->ImplicitDirEntries) {
    entry->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string const text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  std::ostringstream w;
  w << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because files in some directories may conflict with "
    << " libraries in implicit directories:\n"
    << text << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING, w.str(), this->Target->GetBacktrace());
}